

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void mpt_frange(float *range,int len,float *val,int ld)

{
  float *pfVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if (len == 0) {
    range[0] = 0.0;
    range[1] = 0.0;
    return;
  }
  fVar3 = *val;
  range[1] = fVar3;
  *range = fVar3;
  if (1 < len && ld != 0) {
    uVar2 = len + 1;
    pfVar1 = val + ld;
    fVar4 = fVar3;
    do {
      fVar5 = *pfVar1;
      if (fVar5 < fVar4) {
        *range = fVar5;
        fVar4 = fVar5;
        fVar5 = *pfVar1;
      }
      if (fVar3 < fVar5) {
        range[1] = fVar5;
        fVar3 = fVar5;
      }
      uVar2 = uVar2 - 1;
      pfVar1 = pfVar1 + ld;
    } while (2 < uVar2);
  }
  return;
}

Assistant:

extern void MPT_RANGE_FCN(MPT_RANGE_T range[2], int len, const MPT_RANGE_T *val, int ld)
{
	if (!len) {
#ifdef __cplusplus
		range[0] = range[1] = MPT_RANGE_T();
#else
		range[0] = range[1] = 0;
#endif
		return;
	}
	range[0] = range[1] = *val;
	
	if (!ld) {
		return;
	}
	while (--len > 0) {
		val += ld;
		if (*val < range[0]) {
			range[0] = *val;
		}
		if (*val > range[1]) {
			range[1] = *val;
		}
	}
}